

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true> *
__thiscall helics::CommonCore::getHandleInfo(CommonCore *this,InterfaceHandle handle)

{
  BasicHandleInfo *pBVar1;
  shared_mutex *__rwlock;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  pBVar1 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle.hid);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
          *)pBVar1;
}

Assistant:

const BasicHandleInfo* CommonCore::getHandleInfo(InterfaceHandle handle) const
{
    return handles.read([handle](auto& hand) { return hand.getHandleInfo(handle.baseValue()); });
}